

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O1

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayeredRenderCase::verifyImageSingleColoredRow
          (LayeredRenderCase *this,Surface *layer,float rowWidthRatio,Vec4 *barColor,bool logging)

{
  int i;
  int iVar1;
  uint uVar2;
  long lVar3;
  TestLog *pTVar4;
  uint uVar5;
  Surface *surface;
  uint uVar6;
  int iVar7;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  bool bVar8;
  int iVar9;
  int iVar10;
  bool bVar11;
  Surface errorMask;
  RGBA color;
  Vector<bool,_3> res_2;
  Vector<int,_3> res;
  RGBA refColor;
  Vector<int,_3> res_1;
  char local_40b [3];
  string local_408;
  undefined1 local_3e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  string local_3c8;
  ulong local_3a8;
  int local_39c;
  Surface local_398;
  TextureFormat *local_380;
  string local_378;
  string local_358;
  LogImageSet local_338;
  LayeredRenderCase *local_2f8;
  string local_2f0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [6];
  LogImage local_240;
  undefined1 local_1b0 [8];
  int local_1a8;
  ios_base local_138 [264];
  
  local_3a8 = CONCAT44(local_3a8._4_4_,rowWidthRatio);
  iVar9 = layer->m_width;
  local_380 = (TextureFormat *)barColor;
  tcu::Surface::Surface(&local_398,iVar9,layer->m_height);
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Expecting all pixels with distance less or equal to (about) ",
             0x3c);
  iVar9 = (int)((float)iVar9 * (float)local_3a8);
  std::ostream::operator<<((ostringstream *)&local_1a8,iVar9);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8," pixels from left border to be of color ",0x28);
  local_2d0._0_8_ = *local_380;
  local_2d0._8_4_ = local_380[1].order;
  tcu::operator<<((ostream *)&local_1a8,(Vector<float,_3> *)local_2d0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_2d0._0_4_ = RGBA;
  local_2d0._4_4_ = UNORM_INT8;
  if ((void *)local_398.m_pixels.m_cap != (void *)0x0) {
    local_398.m_pixels.m_cap = (size_t)local_398.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1b0,(TextureFormat *)local_2d0,local_398.m_width,
             local_398.m_height,1,(void *)local_398.m_pixels.m_cap);
  local_240.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toIVec((RGBA *)local_2d0);
  tcu::clear((PixelBufferAccess *)local_1b0,(IVec4 *)local_2d0);
  if (layer->m_height < 1) {
    bVar8 = true;
  }
  else {
    local_39c = iVar9 + -1;
    local_3a8 = (ulong)(iVar9 + 1);
    iVar9 = 0;
    bVar8 = true;
    local_2f8 = this;
    do {
      iVar1 = layer->m_width;
      if (0 < iVar1) {
        iVar10 = 0;
        do {
          local_378._M_dataplus._M_p._0_4_ =
               *(undefined4 *)((long)(layer->m_pixels).m_ptr + (long)(iVar1 * iVar9 + iVar10) * 4);
          tcu::RGBA::RGBA((RGBA *)&local_2f0,(Vec4 *)local_380);
          uVar5 = (uint)local_378._M_dataplus._M_p & 0xff;
          uVar6 = (uint)local_378._M_dataplus._M_p & 0xff00;
          uVar2 = (uint)local_378._M_dataplus._M_p & 0xff0000;
          tcu::RGBA::toIVec((RGBA *)local_1b0);
          local_3c8._M_dataplus._M_p = (pointer)local_1b0;
          local_3c8._M_string_length._0_4_ = local_1a8;
          tcu::RGBA::toIVec((RGBA *)local_2d0);
          local_3e8._0_8_ = local_2d0._0_8_;
          local_3e8._8_4_ = local_2d0._8_4_;
          local_338.m_name._M_dataplus._M_p = (pointer)0x0;
          local_338.m_name._M_string_length._0_4_ = 0;
          lVar3 = 0;
          do {
            *(int *)((long)&local_338.m_name._M_dataplus._M_p + lVar3 * 4) =
                 *(int *)((long)&local_3c8._M_dataplus._M_p + lVar3 * 4) -
                 *(int *)(local_3e8 + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_240.m_name._M_string_length._0_4_ = 0;
          local_240.m_name._M_dataplus._M_p = (char *)0x0;
          lVar3 = 0;
          do {
            iVar1 = *(int *)((long)&local_338.m_name._M_dataplus._M_p + lVar3 * 4);
            iVar7 = -iVar1;
            if (0 < iVar1) {
              iVar7 = iVar1;
            }
            *(int *)((long)(&local_240.m_access.m_size + -6) + lVar3 * 4) = iVar7;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_408._M_dataplus._M_p = (pointer)0x800000008;
          local_408._M_string_length._0_4_ = 8;
          local_358._M_dataplus._M_p = local_358._M_dataplus._M_p & 0xffffffffff000000;
          lVar3 = 0;
          do {
            *(bool *)((long)&local_358._M_dataplus._M_p + lVar3) =
                 *(int *)((long)(&local_240.m_access.m_size + -6) + lVar3 * 4) <
                 *(int *)((long)&local_408._M_dataplus._M_p + lVar3 * 4);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          local_40b[0] = '\x01';
          local_40b[1] = '\x01';
          local_40b[2] = 1;
          bVar11 = true;
          lVar3 = 0;
          do {
            if (bVar11) {
              bVar11 = *(char *)((long)&local_358._M_dataplus._M_p + lVar3) == local_40b[lVar3];
            }
            else {
              bVar11 = false;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 3);
          if (local_39c < iVar10) {
            bVar11 = (bool)(((uVar6 < 0x900 || uVar5 < 9) || uVar2 < 0x90000) |
                           iVar10 < (int)(float)local_3a8 & bVar11);
          }
          if (!bVar11) {
            *(undefined4 *)
             ((long)local_398.m_pixels.m_ptr + (long)(local_398.m_width * iVar9 + iVar10) * 4) =
                 0xff0000ff;
          }
          bVar8 = (bool)(bVar8 & bVar11);
          iVar10 = iVar10 + 1;
          iVar1 = layer->m_width;
        } while (iVar10 < iVar1);
      }
      iVar9 = iVar9 + 1;
      this = local_2f8;
    } while (iVar9 < layer->m_height);
  }
  if (bVar8 == false) {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Image verification failed. Got unexpected pixels.",0x31);
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"LayerContent","");
    local_3e8._0_8_ = &local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Layer content","");
    tcu::LogImageSet::LogImageSet(&local_338,&local_3c8,(string *)local_3e8);
    tcu::TestLog::startImageSet
              (pTVar4,local_338.m_name._M_dataplus._M_p,local_338.m_description._M_dataplus._M_p);
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Layer","");
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"Layer","");
    tcu::LogImage::LogImage
              ((LogImage *)local_2d0,&local_408,&local_378,layer,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2d0,(int)pTVar4,__buf_00,(size_t)layer);
    local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"ErrorMask","");
    local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,"Errors","");
    surface = &local_398;
    tcu::LogImage::LogImage(&local_240,&local_2f0,&local_358,surface,QP_IMAGE_COMPRESSION_MODE_BEST)
    ;
    tcu::LogImage::write(&local_240,(int)pTVar4,__buf_01,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_358._M_dataplus._M_p != &local_358.field_2) {
      operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._0_8_ != &local_2c0) {
      operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_description._M_dataplus._M_p != &local_338.m_description.field_2) {
      operator_delete(local_338.m_description._M_dataplus._M_p,
                      local_338.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._0_8_ != &local_3d8) {
      operator_delete((void *)local_3e8._0_8_,local_3d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_1b0 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,"Image is valid.",0xf);
    pTVar4 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_338.m_name._M_dataplus._M_p = (pointer)&local_338.m_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"LayerContent","");
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Layer content","");
    tcu::LogImageSet::LogImageSet((LogImageSet *)&local_240,&local_338.m_name,&local_3c8);
    tcu::TestLog::startImageSet
              (pTVar4,local_240.m_name._M_dataplus._M_p,local_240.m_description._M_dataplus._M_p);
    local_3e8._0_8_ = &local_3d8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3e8,"Layer","");
    local_408._M_dataplus._M_p = (pointer)&local_408.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_408,"Layer","");
    tcu::LogImage::LogImage
              ((LogImage *)local_2d0,(string *)local_3e8,&local_408,layer,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)local_2d0,(int)pTVar4,__buf,(size_t)layer);
    tcu::TestLog::endImageSet(pTVar4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_p != local_2a0) {
      operator_delete(local_2b0._M_p,local_2a0[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._0_8_ != &local_2c0) {
      operator_delete((void *)local_2d0._0_8_,local_2c0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_408._M_dataplus._M_p != &local_408.field_2) {
      operator_delete(local_408._M_dataplus._M_p,local_408.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._0_8_ != &local_3d8) {
      operator_delete((void *)local_3e8._0_8_,local_3d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_description._M_dataplus._M_p != &local_240.m_description.field_2) {
      operator_delete(local_240.m_description._M_dataplus._M_p,
                      local_240.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.m_name._M_dataplus._M_p != &local_240.m_name.field_2) {
      operator_delete(local_240.m_name._M_dataplus._M_p,
                      local_240.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338.m_name._M_dataplus._M_p != &local_338.m_name.field_2) {
      operator_delete(local_338.m_name._M_dataplus._M_p,
                      local_338.m_name.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  tcu::Surface::~Surface(&local_398);
  return bVar8;
}

Assistant:

bool LayeredRenderCase::verifyImageSingleColoredRow (const tcu::Surface& layer, float rowWidthRatio, const tcu::Vec4& barColor, bool logging)
{
	DE_ASSERT(rowWidthRatio > 0.0f);

	const int		barLength			= (int)(rowWidthRatio * (float)layer.getWidth());
	const int		barLengthThreshold	= 1;
	tcu::Surface	errorMask			(layer.getWidth(), layer.getHeight());
	bool			allPixelsOk			= true;

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Message << "Expecting all pixels with distance less or equal to (about) " << barLength << " pixels from left border to be of color " << barColor.swizzle(0,1,2) << "." << tcu::TestLog::EndMessage;

	tcu::clear(errorMask.getAccess(), tcu::RGBA::green().toIVec());

	for (int y = 0; y < layer.getHeight(); ++y)
	for (int x = 0; x < layer.getWidth(); ++x)
	{
		const tcu::RGBA color		= layer.getPixel(x, y);
		const tcu::RGBA refColor	= tcu::RGBA(barColor);
		const int		threshold	= 8;
		const bool		isBlack		= color.getRed() <= threshold || color.getGreen() <= threshold || color.getBlue() <= threshold;
		const bool		isColor		= tcu::allEqual(tcu::lessThan(tcu::abs(color.toIVec().swizzle(0, 1, 2) - refColor.toIVec().swizzle(0, 1, 2)), tcu::IVec3(threshold, threshold, threshold)), tcu::BVec3(true, true, true));

		bool			isOk;

		if (x <= barLength - barLengthThreshold)
			isOk = isColor;
		else if (x >= barLength + barLengthThreshold)
			isOk = isBlack;
		else
			isOk = isColor || isBlack;

		allPixelsOk &= isOk;

		if (!isOk)
			errorMask.setPixel(x, y, tcu::RGBA::red());
	}

	if (allPixelsOk)
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image is valid." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer", "Layer", layer)
								<< tcu::TestLog::EndImageSet;
		return true;
	}
	else
	{
		if (logging)
			m_testCtx.getLog()	<< tcu::TestLog::Message << "Image verification failed. Got unexpected pixels." << tcu::TestLog::EndMessage
								<< tcu::TestLog::ImageSet("LayerContent", "Layer content")
								<< tcu::TestLog::Image("Layer",		"Layer",	layer)
								<< tcu::TestLog::Image("ErrorMask",	"Errors",	errorMask)
								<< tcu::TestLog::EndImageSet;
		return false;
	}

	if (logging)
		m_testCtx.getLog() << tcu::TestLog::Image("LayerContent", "Layer content", layer);

	return allPixelsOk;
}